

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularPriorityQueue.hpp
# Opt level: O0

void __thiscall CircularPriorityQueue<int>::pop(CircularPriorityQueue<int> *this)

{
  Node<int> *pNVar1;
  bool bVar2;
  Node<int> *pNVar3;
  CircularPriorityQueue<int> *in_RDI;
  bool needToDelete;
  Node<int> *nodeToPop;
  Node<int> *prev;
  Node<int> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  pNVar3 = getPrevPriorNode(in_RDI);
  pNVar1 = pNVar3->next;
  std::mutex::lock((mutex *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  bVar2 = Node<int>::pop(in_stack_ffffffffffffffd8);
  if ((bVar2) && (pNVar3->next != pNVar1->next)) {
    pNVar3->next = pNVar1->next;
  }
  std::mutex::unlock((mutex *)0x103bdf);
  return;
}

Assistant:

void pop() {
        Node<T> *prev = getPrevPriorNode();
        Node<T> *nodeToPop = prev->next;

        nodeToPop->usedMutex.lock();
        bool needToDelete = nodeToPop->pop();
        if (needToDelete && prev->next != nodeToPop->next) {
            prev->next = nodeToPop->next;
        }
        nodeToPop->usedMutex.unlock();
    }